

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImFontGlyphRangesBuilder::BuildRanges
          (ImFontGlyphRangesBuilder *this,ImVector<unsigned_short> *out_ranges)

{
  bool bVar1;
  bool local_31;
  unsigned_short local_26;
  unsigned_short local_24;
  unsigned_short local_22;
  int local_20;
  undefined4 local_1c;
  int n;
  int max_codepoint;
  ImVector<unsigned_short> *out_ranges_local;
  ImFontGlyphRangesBuilder *this_local;
  
  local_1c = 0xffff;
  _n = out_ranges;
  out_ranges_local = (ImVector<unsigned_short> *)this;
  for (local_20 = 0; local_20 < 0x10000; local_20 = local_20 + 1) {
    bVar1 = GetBit(this,(long)local_20);
    if (bVar1) {
      local_22 = (unsigned_short)local_20;
      ImVector<unsigned_short>::push_back(_n,&local_22);
      while( true ) {
        local_31 = false;
        if (local_20 < 0xffff) {
          local_31 = GetBit(this,(long)(local_20 + 1));
        }
        if (local_31 == false) break;
        local_20 = local_20 + 1;
      }
      local_24 = (unsigned_short)local_20;
      ImVector<unsigned_short>::push_back(_n,&local_24);
    }
  }
  local_26 = 0;
  ImVector<unsigned_short>::push_back(_n,&local_26);
  return;
}

Assistant:

void ImFontGlyphRangesBuilder::BuildRanges(ImVector<ImWchar>* out_ranges)
{
    const int max_codepoint = IM_UNICODE_CODEPOINT_MAX;
    for (int n = 0; n <= max_codepoint; n++)
        if (GetBit(n))
        {
            out_ranges->push_back((ImWchar)n);
            while (n < max_codepoint && GetBit(n + 1))
                n++;
            out_ranges->push_back((ImWchar)n);
        }
    out_ranges->push_back(0);
}